

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,double d)

{
  bool bVar1;
  undefined8 in_RDI;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_XMM0_Qa;
  double unaff_retaddr;
  undefined1 ret;
  
  ret = (undefined1)((ulong)in_RDI >> 0x38);
  Prefix(this,d._4_4_);
  WriteDouble((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *)d,unaff_retaddr);
  bVar1 = EndValue(in_XMM0_Qa,(bool)ret);
  return bVar1;
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return EndValue(WriteDouble(d)); }